

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O1

aiScene * ImportModel(ImportData *imp,string *path)

{
  bool bVar1;
  clock_t cVar2;
  aiScene *paVar3;
  clock_t cVar4;
  char *pcVar5;
  int __sig;
  __pid_t __pid;
  
  if (imp->log == true) {
    SetLogStreams(imp);
  }
  puts("Launching asset import ...           OK");
  bVar1 = Assimp::Importer::ValidateFlags(globalImporter,imp->ppFlags);
  if (bVar1) {
    puts("Validating postprocessing flags ...  OK");
    if (imp->showLog == true) {
      puts("-----------------------------------------------------------------");
    }
    cVar2 = clock();
    pcVar5 = (path->_M_dataplus)._M_p;
    paVar3 = Assimp::Importer::ReadFile(globalImporter,pcVar5,imp->ppFlags);
    __sig = (int)pcVar5;
    if (imp->showLog == true) {
      puts("-----------------------------------------------------------------");
    }
    if (paVar3 == (aiScene *)0x0) {
      pcVar5 = Assimp::Importer::GetErrorString(globalImporter);
      paVar3 = (aiScene *)0x0;
      printf("ERROR: Failed to load file: %s\n",pcVar5);
    }
    else {
      cVar4 = clock();
      __pid = 0x6b81be;
      printf("Importing file ...                   OK \n   import took approx. %.5f seconds\n\n",
             (double)(cVar4 - cVar2) / 1000000.0);
      if (imp->log == true) {
        Assimp::DefaultLogger::kill(__pid,__sig);
      }
    }
  }
  else {
    puts("ERROR: Unsupported post-processing flags ");
    paVar3 = (aiScene *)0x0;
  }
  return paVar3;
}

Assistant:

const aiScene* ImportModel(
	const ImportData& imp, 
	const std::string& path)
{
	// Attach log streams
	if (imp.log) {
		SetLogStreams(imp);
	}
	printf("Launching asset import ...           OK\n");

	// Now validate this flag combination
	if(!globalImporter->ValidateFlags(imp.ppFlags)) {
		printf("ERROR: Unsupported post-processing flags \n");
		return NULL;
	}
	printf("Validating postprocessing flags ...  OK\n");
	if (imp.showLog) {
		PrintHorBar();
	}
		

	// do the actual import, measure time
	const clock_t first = clock();
	const aiScene* scene = globalImporter->ReadFile(path,imp.ppFlags);

	if (imp.showLog) {
		PrintHorBar();
	}
	if (!scene) {
		printf("ERROR: Failed to load file: %s\n", globalImporter->GetErrorString());
		return NULL;
	}

	const clock_t second = ::clock();
	const double seconds = static_cast<double>(second-first) / CLOCKS_PER_SEC;

	printf("Importing file ...                   OK \n   import took approx. %.5f seconds\n"
		"\n",seconds);

	if (imp.log) { 
		FreeLogStreams();
	}
	return scene;
}